

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O1

void __thiscall DObject::SerializeUserVars(DObject *this,FSerializer *arc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (arc->w != (FWriter *)0x0) {
    if (this->Class == (PClass *)0x0) {
      iVar1 = (**this->_vptr_DObject)(this);
      this->Class = (PClass *)CONCAT44(extraout_var,iVar1);
    }
    PClass::WriteAllFields(this->Class,arc,this);
    return;
  }
  if (this->Class == (PClass *)0x0) {
    iVar1 = (**this->_vptr_DObject)(this);
    this->Class = (PClass *)CONCAT44(extraout_var_00,iVar1);
  }
  PClass::ReadAllFields(this->Class,arc,this);
  return;
}

Assistant:

void DObject::SerializeUserVars(FSerializer &arc)
{
	if (arc.isWriting())
	{
		// Write all fields that aren't serialized by native code.
		GetClass()->WriteAllFields(arc, this);
	}
	else
	{
		GetClass()->ReadAllFields(arc, this);
	}
}